

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retrieval.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  pointer pcVar3;
  pointer ppVar4;
  pointer ppVar5;
  llama_model_ptr lVar6;
  llama_context_ptr ctx;
  int32_t iVar7;
  bool bVar8;
  char cVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  common_log *pcVar15;
  long *plVar16;
  long lVar17;
  undefined8 uVar18;
  ulong uVar19;
  pointer pbVar20;
  char *fmt;
  int i;
  pointer pcVar21;
  pointer __first;
  ulong uVar22;
  ulong uVar23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *context_file;
  pointer pbVar24;
  pointer puVar25;
  int j;
  long lVar26;
  pointer ppVar27;
  float fVar28;
  vector<chunk,_std::allocator<chunk>_> chunks;
  vector<chunk,_std::allocator<chunk>_> file_chunk;
  vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> similarities;
  vector<float,_std::allocator<float>_> embeddings;
  pair<int,_float> local_1a90;
  vector<float,_std::allocator<float>_> query_emb;
  common_init_result llama_init;
  _Alloc_hider local_1a48;
  size_type local_1a40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a38;
  undefined1 local_1a28 [16];
  undefined1 local_1a18 [16];
  undefined1 local_1a08 [16];
  string query;
  llama_batch query_batch;
  llama_batch batch;
  common_params params;
  
  common_params::common_params(&params);
  bVar8 = common_params_parse(argc,argv,&params,LLAMA_EXAMPLE_RETRIEVAL,print_usage);
  iVar12 = 1;
  if (!bVar8) goto LAB_00130243;
  common_init();
  params.n_ubatch = params.n_batch;
  params.embedding = true;
  if (params.chunk_size < 1) {
    if (common_log_verbosity_thold < 0) goto LAB_00130243;
    pcVar15 = common_log_main();
    fmt = "chunk_size must be positive\n";
  }
  else {
    if (params.context_files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        params.context_files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar24 = params.context_files.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar20 = params.context_files.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (-1 < common_log_verbosity_thold) {
        pcVar15 = common_log_main();
        common_log_add(pcVar15,GGML_LOG_LEVEL_INFO,"processing files:\n");
        pbVar24 = params.context_files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar20 = params.context_files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; pbVar24 != pbVar20; pbVar24 = pbVar24 + 1) {
        if (-1 < common_log_verbosity_thold) {
          pcVar15 = common_log_main();
          common_log_add(pcVar15,GGML_LOG_LEVEL_INFO,"%s\n",(pbVar24->_M_dataplus)._M_p);
        }
      }
      chunks.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      chunks.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      chunks.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      for (pbVar20 = params.context_files.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; iVar7 = params.chunk_size,
          pbVar20 !=
          params.context_files.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar20 = pbVar20 + 1) {
        file_chunk.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        file_chunk.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        file_chunk.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        std::ifstream::ifstream(&query_batch,(pbVar20->_M_dataplus)._M_p,_S_in);
        cVar9 = std::__basic_file<char>::is_open();
        if (cVar9 == '\0') {
          if (-1 < common_log_verbosity_thold) {
            pcVar15 = common_log_main();
            common_log_add(pcVar15,GGML_LOG_LEVEL_ERROR,"could not open file %s\n",
                           (pbVar20->_M_dataplus)._M_p);
          }
        }
        else {
          llama_init.model._M_t.super___uniq_ptr_impl<llama_model,_llama_model_deleter>._M_t.
          super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
          super__Head_base<0UL,_llama_model_*,_false>._M_head_impl =
               (__uniq_ptr_data<llama_model,_llama_model_deleter,_true,_true>)&llama_init.lora;
          llama_init.context._M_t.super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
          super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
          super__Head_base<0UL,_llama_context_*,_false>._M_head_impl =
               (__uniq_ptr_data<llama_context,_llama_context_deleter,_true,_true>)
               (__uniq_ptr_impl<llama_context,_llama_context_deleter>)0x0;
          llama_init.lora.
          super__Vector_base<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>,_std::allocator<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
          local_1a48._M_p = (pointer)&local_1a38;
          local_1a40 = 0;
          local_1a38._M_local_buf[0] = '\0';
          local_1a08 = (undefined1  [16])0x0;
          embeddings.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&embeddings.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
          embeddings.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1a18 = (undefined1  [16])0x0;
          local_1a28 = (undefined1  [16])0x0;
          embeddings.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          puVar25 = (pointer)0x0;
          while( true ) {
            plVar16 = (long *)std::istream::read((char *)&query_batch,(long)&batch);
            if ((*(byte *)((long)plVar16 + *(long *)(*plVar16 + -0x18) + 0x20) & 5) != 0) break;
            query._M_dataplus._M_p = (pointer)&query.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&query,&batch,(long)query_batch.token + (long)&batch);
            std::__cxx11::string::append((string *)&embeddings);
            while( true ) {
              std::__cxx11::string::~string((string *)&query);
              lVar17 = std::__cxx11::string::find
                                 ((string *)&embeddings,(ulong)&params.chunk_separator);
              if (lVar17 == -1) break;
              std::__cxx11::string::substr((ulong)&query,(ulong)&embeddings);
              std::__cxx11::string::append((string *)&local_1a48);
              std::__cxx11::string::~string((string *)&query);
              if (iVar7 < (int)local_1a40) {
                llama_init.lora.
                super__Vector_base<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>,_std::allocator<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar25;
                std::__cxx11::string::_M_assign((string *)&llama_init);
                std::vector<chunk,_std::allocator<chunk>_>::push_back
                          (&file_chunk,(chunk *)&llama_init);
                puVar25 = (pointer)((long)&(puVar25->_M_t).
                                           super___uniq_ptr_impl<llama_adapter_lora,_llama_adapter_lora_deleter>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_llama_adapter_lora_*,_llama_adapter_lora_deleter>
                                           .super__Head_base<0UL,_llama_adapter_lora_*,_false>.
                                           _M_head_impl + (long)(int)local_1a40);
                query._M_dataplus._M_p = (pointer)&query.field_2;
                query.field_2 =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      )0x0;
                query._M_string_length = 0;
                chunk::operator=((chunk *)&llama_init,(chunk *)&query);
                chunk::~chunk((chunk *)&query);
              }
              std::__cxx11::string::substr((ulong)&query,(ulong)&embeddings);
              std::__cxx11::string::operator=((string *)&embeddings,(string *)&query);
            }
          }
          if (local_1a40 != 0) {
            if (file_chunk.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                super__Vector_impl_data._M_start ==
                file_chunk.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              llama_init.lora.
              super__Vector_base<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>,_std::allocator<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar25;
              std::__cxx11::string::_M_assign((string *)&llama_init);
              std::vector<chunk,_std::allocator<chunk>_>::push_back
                        (&file_chunk,(chunk *)&llama_init);
            }
            else {
              std::__cxx11::string::append
                        ((string *)
                         &file_chunk.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                          super__Vector_impl_data._M_finish[-1].textdata);
            }
          }
          std::ifstream::close();
          std::__cxx11::string::~string((string *)&embeddings);
          chunk::~chunk((chunk *)&llama_init);
        }
        std::ifstream::~ifstream(&query_batch);
        std::vector<chunk,std::allocator<chunk>>::
        insert<__gnu_cxx::__normal_iterator<chunk*,std::vector<chunk,std::allocator<chunk>>>,void>
                  ((vector<chunk,std::allocator<chunk>> *)&chunks,
                   (const_iterator)
                   chunks.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (__normal_iterator<chunk_*,_std::vector<chunk,_std::allocator<chunk>_>_>)
                   file_chunk.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (__normal_iterator<chunk_*,_std::vector<chunk,_std::allocator<chunk>_>_>)
                   file_chunk.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        std::vector<chunk,_std::allocator<chunk>_>::~vector(&file_chunk);
      }
      if (-1 < common_log_verbosity_thold) {
        pcVar15 = common_log_main();
        common_log_add(pcVar15,GGML_LOG_LEVEL_INFO,"Number of chunks: %zu\n",
                       ((long)chunks.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)chunks.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                             super__Vector_impl_data._M_start) / 0x78);
      }
      llama_backend_init();
      llama_numa_init(params.numa);
      common_init_from_params(&llama_init,&params);
      ctx = llama_init.context;
      lVar6 = llama_init.model;
      if ((__uniq_ptr_impl<llama_model,_llama_model_deleter>)
          llama_init.model._M_t.super___uniq_ptr_impl<llama_model,_llama_model_deleter>._M_t.
          super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
          super__Head_base<0UL,_llama_model_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<llama_model,_llama_model_deleter>)0x0) {
        iVar12 = 1;
        if (-1 < common_log_verbosity_thold) {
          pcVar15 = common_log_main();
          common_log_add(pcVar15,GGML_LOG_LEVEL_ERROR,"%s: unable to load model\n","main");
        }
      }
      else {
        uVar18 = llama_model_get_vocab
                           (llama_init.model._M_t.
                            super___uniq_ptr_impl<llama_model,_llama_model_deleter>._M_t.
                            super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
                            super__Head_base<0UL,_llama_model_*,_false>._M_head_impl);
        uVar10 = llama_model_n_ctx_train
                           (lVar6._M_t.super___uniq_ptr_impl<llama_model,_llama_model_deleter>._M_t.
                            super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
                            super__Head_base<0UL,_llama_model_*,_false>._M_head_impl);
        uVar11 = llama_n_ctx(ctx._M_t.super___uniq_ptr_impl<llama_context,_llama_context_deleter>.
                             _M_t.super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                             super__Head_base<0UL,_llama_context_*,_false>._M_head_impl);
        iVar12 = llama_pooling_type(ctx._M_t.
                                    super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t
                                    .super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                                    super__Head_base<0UL,_llama_context_*,_false>._M_head_impl);
        if (iVar12 == 0) {
          iVar12 = 1;
          if (-1 < common_log_verbosity_thold) {
            pcVar15 = common_log_main();
            common_log_add(pcVar15,GGML_LOG_LEVEL_ERROR,"%s: pooling type NONE not supported\n",
                           "main");
          }
        }
        else {
          if (-1 < common_log_verbosity_thold && (int)uVar10 < (int)uVar11) {
            pcVar15 = common_log_main();
            common_log_add(pcVar15,GGML_LOG_LEVEL_WARN,
                           "%s: warning: model was trained on only %d context tokens (%d specified)\n"
                           ,"main",(ulong)uVar10,(ulong)uVar11);
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar15 = common_log_main();
            common_log_add(pcVar15,GGML_LOG_LEVEL_INFO,"\n");
            if (-1 < common_log_verbosity_thold) {
              pcVar15 = common_log_main();
              common_params_get_system_info_abi_cxx11_((string *)&batch,&params);
              common_log_add(pcVar15,GGML_LOG_LEVEL_INFO,"%s\n",CONCAT44(batch._4_4_,batch.n_tokens)
                            );
              std::__cxx11::string::~string((string *)&batch);
            }
          }
          uVar19 = (ulong)params.n_batch;
          if (params.n_batch < params.n_ctx) {
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/retrieval/retrieval.cpp"
                       ,0xba,"GGML_ASSERT(%s) failed","params.n_batch >= params.n_ctx");
          }
          pcVar3 = chunks.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          iVar12 = 0;
          pcVar21 = chunks.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            if (pcVar21 == pcVar3) {
              if (params.verbose_prompt == true) {
                uVar22 = 0;
                while( true ) {
                  uVar10 = (uint)(((long)chunks.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)chunks.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                        _M_impl.super__Vector_impl_data._M_start) / 0x78);
                  if ((long)(int)uVar10 <= (long)uVar22) break;
                  if (-1 < common_log_verbosity_thold) {
                    pcVar15 = common_log_main();
                    common_log_add(pcVar15,GGML_LOG_LEVEL_INFO,"%s: prompt %d: \'%s\'\n","main",
                                   uVar22 & 0xffffffff,
                                   chunks.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                                   super__Vector_impl_data._M_start[uVar22].textdata._M_dataplus.
                                   _M_p);
                    if (-1 < common_log_verbosity_thold) {
                      pcVar15 = common_log_main();
                      common_log_add(pcVar15,GGML_LOG_LEVEL_INFO,
                                     "%s: number of tokens in prompt = %zu\n","main",
                                     (long)chunks.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                           _M_impl.super__Vector_impl_data._M_start[uVar22].tokens.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_finish -
                                     (long)chunks.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                           _M_impl.super__Vector_impl_data._M_start[uVar22].tokens.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start >> 2);
                    }
                  }
                  for (lVar17 = 0;
                      lVar17 < (int)((ulong)((long)chunks.
                                                  super__Vector_base<chunk,_std::allocator<chunk>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar22].
                                                  tokens.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                            (long)chunks.
                                                  super__Vector_base<chunk,_std::allocator<chunk>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar22].
                                                  tokens.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
                      lVar17 = lVar17 + 1) {
                    if (-1 < common_log_verbosity_thold) {
                      pcVar15 = common_log_main();
                      uVar10 = chunks.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar22].tokens.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar17];
                      common_token_to_piece_abi_cxx11_
                                ((string *)&batch,
                                 (llama_context *)
                                 ctx._M_t.
                                 super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                                 super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                                 super__Head_base<0UL,_llama_context_*,_false>._M_head_impl,uVar10,
                                 true);
                      common_log_add(pcVar15,GGML_LOG_LEVEL_INFO,"%6d -> \'%s\'\n",(ulong)uVar10,
                                     CONCAT44(batch._4_4_,batch.n_tokens));
                      std::__cxx11::string::~string((string *)&batch);
                    }
                  }
                  if (-1 < common_log_verbosity_thold) {
                    pcVar15 = common_log_main();
                    common_log_add(pcVar15,GGML_LOG_LEVEL_INFO,"\n\n");
                  }
                  uVar22 = uVar22 + 1;
                }
              }
              else {
                uVar10 = (uint)(((long)chunks.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)chunks.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                      _M_impl.super__Vector_impl_data._M_start) / 0x78);
              }
              llama_batch_init(&batch,uVar19,0,1);
              iVar12 = llama_model_n_embd(lVar6._M_t.
                                          super___uniq_ptr_impl<llama_model,_llama_model_deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>
                                          .super__Head_base<0UL,_llama_model_*,_false>._M_head_impl)
              ;
              query_batch.n_tokens = 0;
              std::vector<float,_std::allocator<float>_>::vector
                        (&embeddings,(long)(int)(iVar12 * uVar10),
                         (value_type_conflict2 *)&query_batch,(allocator_type *)&query);
              __first = embeddings.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar23 = 0;
              uVar22 = (ulong)uVar10;
              if ((int)uVar10 < 1) {
                uVar22 = uVar23;
              }
              iVar13 = 0;
              iVar14 = 0;
              for (; uVar22 * 0x78 != uVar23; uVar23 = uVar23 + 0x78) {
                pcVar3 = chunks.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if (uVar19 < (ulong)((long)batch.n_tokens +
                                    (*(long *)((long)&((chunks.
                                                  super__Vector_base<chunk,_std::allocator<chunk>_>.
                                                  _M_impl.super__Vector_impl_data._M_start)->tokens)
                                                  .super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish + uVar23
                                              ) -
                                     *(long *)((long)&((chunks.
                                                  super__Vector_base<chunk,_std::allocator<chunk>_>.
                                                  _M_impl.super__Vector_impl_data._M_start)->tokens)
                                                  .super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + uVar23)
                                    >> 2))) {
                  batch_decode((llama_context *)
                               ctx._M_t.super___uniq_ptr_impl<llama_context,_llama_context_deleter>.
                               _M_t.super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                               super__Head_base<0UL,_llama_context_*,_false>._M_head_impl,&batch,
                               __first + iVar13 * iVar12,iVar14,iVar12);
                  common_batch_clear(&batch);
                  iVar13 = iVar13 + iVar14;
                  iVar14 = 0;
                }
                batch_add_seq(&batch,(vector<int,_std::allocator<int>_> *)
                                     ((long)&(pcVar3->tokens).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start + uVar23),iVar14);
                iVar14 = iVar14 + 1;
              }
              batch_decode((llama_context *)
                           ctx._M_t.super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t
                           .super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                           super__Head_base<0UL,_llama_context_*,_false>._M_head_impl,&batch,
                           __first + iVar13 * iVar12,iVar14,iVar12);
              for (uVar23 = 0; uVar22 * 0x78 != uVar23; uVar23 = uVar23 + 0x78) {
                std::vector<float,std::allocator<float>>::vector<float*,void>
                          ((vector<float,std::allocator<float>> *)&query_batch,__first,
                           __first + iVar12,(allocator_type *)&query);
                std::vector<float,_std::allocator<float>_>::_M_move_assign
                          ((vector<float,_std::allocator<float>_> *)
                           ((long)&((chunks.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->embedding).
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_start + uVar23),&query_batch);
                std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                          ((_Vector_base<float,_std::allocator<float>_> *)&query_batch);
                lVar17 = *(long *)((long)&((chunks.super__Vector_base<chunk,_std::allocator<chunk>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->tokens).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start + uVar23);
                if (*(long *)((long)&((chunks.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                       _M_impl.super__Vector_impl_data._M_start)->tokens).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish + uVar23) != lVar17) {
                  *(long *)((long)&((chunks.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->tokens).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish + uVar23) = lVar17;
                }
                __first = __first + iVar12;
              }
              llama_batch_init(&query_batch,uVar19,0,1);
              query._M_dataplus._M_p = (pointer)&query.field_2;
              query._M_string_length = 0;
              auVar1[0xf] = 0;
              auVar1._0_15_ = query.field_2._1_15_;
              query.field_2 =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    )(auVar1 << 8);
              do {
                if (-1 < common_log_verbosity_thold) {
                  pcVar15 = common_log_main();
                  common_log_add(pcVar15,GGML_LOG_LEVEL_NONE,"Enter query: ");
                }
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&std::cin,(string *)&query);
                common_tokenize((vector<int,_std::allocator<int>_> *)&file_chunk,
                                (llama_context *)
                                ctx._M_t.super___uniq_ptr_impl<llama_context,_llama_context_deleter>
                                ._M_t.super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>
                                .super__Head_base<0UL,_llama_context_*,_false>._M_head_impl,&query,
                                true,false);
                batch_add_seq(&query_batch,(vector<int,_std::allocator<int>_> *)&file_chunk,0);
                auVar2._12_4_ = 0;
                auVar2._0_12_ =
                     (undefined1  [12])
                     similarities.
                     super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                     ._M_impl.super__Vector_impl_data._4_12_;
                similarities.
                super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>.
                _M_impl.super__Vector_impl_data._0_16_ = auVar2 << 0x20;
                std::vector<float,_std::allocator<float>_>::vector
                          (&query_emb,(long)iVar12,(value_type_conflict2 *)&similarities,
                           (allocator_type *)&local_1a90);
                batch_decode((llama_context *)
                             ctx._M_t.super___uniq_ptr_impl<llama_context,_llama_context_deleter>.
                             _M_t.super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                             super__Head_base<0UL,_llama_context_*,_false>._M_head_impl,&query_batch
                             ,query_emb.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,1,iVar12);
                common_batch_clear(&query_batch);
                similarities.
                super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                similarities.
                super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                similarities.
                super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                lVar17 = 0x60;
                for (uVar19 = 0; uVar22 != uVar19; uVar19 = uVar19 + 1) {
                  fVar28 = common_embd_similarity_cos
                                     (*(float **)
                                       ((long)&((chunks.
                                                 super__Vector_base<chunk,_std::allocator<chunk>_>.
                                                 _M_impl.super__Vector_impl_data._M_start)->filename
                                               )._M_dataplus._M_p + lVar17),
                                      query_emb.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start,iVar12);
                  local_1a90 = (pair<int,_float>)(((ulong)(uint)fVar28 << 0x20) + uVar19);
                  std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>::
                  emplace_back<std::pair<int,float>>
                            ((vector<std::pair<int,float>,std::allocator<std::pair<int,float>>> *)
                             &similarities,&local_1a90);
                  lVar17 = lVar17 + 0x78;
                }
                ppVar4 = similarities.
                         super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                ppVar5 = similarities.
                         super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                if (similarities.
                    super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    similarities.
                    super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  lVar26 = (long)similarities.
                                 super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)similarities.
                                 super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  uVar19 = lVar26 >> 3;
                  lVar17 = 0x3f;
                  if (uVar19 != 0) {
                    for (; uVar19 >> lVar17 == 0; lVar17 = lVar17 + -1) {
                    }
                  }
                  std::
                  __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,float>*,std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                            (similarities.
                             super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             similarities.
                             super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             ((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
                  if (lVar26 < 0x81) {
                    std::
                    __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,float>*,std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                              (ppVar4);
                  }
                  else {
                    ppVar27 = ppVar4 + 0x10;
                    std::
                    __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,float>*,std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                              (ppVar4);
                    for (; ppVar27 != ppVar5; ppVar27 = ppVar27 + 1) {
                      std::
                      __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<int,float>*,std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>>,__gnu_cxx::__ops::_Val_comp_iter<main::__0>>
                                (ppVar27);
                    }
                  }
                }
                if (-1 < common_log_verbosity_thold) {
                  pcVar15 = common_log_main();
                  common_log_add(pcVar15,GGML_LOG_LEVEL_NONE,"Top %d similar chunks:\n",
                                 (ulong)(uint)params.sampling.top_k);
                }
                lVar17 = 0;
                while( true ) {
                  iVar13 = (int)(((long)chunks.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)chunks.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                       _M_impl.super__Vector_impl_data._M_start) / 0x78);
                  if (params.sampling.top_k < iVar13) {
                    iVar13 = params.sampling.top_k;
                  }
                  if (iVar13 <= lVar17) break;
                  if (-1 < common_log_verbosity_thold) {
                    pcVar15 = common_log_main();
                    common_log_add(pcVar15,GGML_LOG_LEVEL_NONE,"filename: %s\n",
                                   chunks.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                                   super__Vector_impl_data._M_start
                                   [similarities.
                                    super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar17].first].
                                   filename._M_dataplus._M_p);
                    if (-1 < common_log_verbosity_thold) {
                      pcVar15 = common_log_main();
                      common_log_add(pcVar15,GGML_LOG_LEVEL_NONE,"filepos: %lld\n",
                                     chunks.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                     _M_impl.super__Vector_impl_data._M_start
                                     [similarities.
                                      super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar17].first].
                                     filepos);
                      if (-1 < common_log_verbosity_thold) {
                        pcVar15 = common_log_main();
                        common_log_add(pcVar15,GGML_LOG_LEVEL_NONE,"similarity: %f\n",
                                       (double)similarities.
                                               super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[lVar17].
                                               second);
                        if (-1 < common_log_verbosity_thold) {
                          pcVar15 = common_log_main();
                          common_log_add(pcVar15,GGML_LOG_LEVEL_NONE,"textdata:\n%s\n",
                                         chunks.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                         _M_impl.super__Vector_impl_data._M_start
                                         [similarities.
                                          super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar17].first].
                                         textdata._M_dataplus._M_p);
                          if (-1 < common_log_verbosity_thold) {
                            pcVar15 = common_log_main();
                            common_log_add(pcVar15,GGML_LOG_LEVEL_NONE,"--------------------\n");
                          }
                        }
                      }
                    }
                  }
                  lVar17 = lVar17 + 1;
                }
                std::_Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
                ~_Vector_base((_Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                               *)&similarities);
                std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                          (&query_emb.super__Vector_base<float,_std::allocator<float>_>);
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                          ((_Vector_base<int,_std::allocator<int>_> *)&file_chunk);
              } while( true );
            }
            common_tokenize((vector<int,_std::allocator<int>_> *)&batch,
                            (llama_context *)
                            ctx._M_t.super___uniq_ptr_impl<llama_context,_llama_context_deleter>.
                            _M_t.super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                            super__Head_base<0UL,_llama_context_*,_false>._M_head_impl,
                            &pcVar21->textdata,true,false);
            uVar22 = (long)batch.token - CONCAT44(batch._4_4_,batch.n_tokens) >> 2;
            if (uVar19 < uVar22) {
              iVar12 = 1;
              if (-1 < common_log_verbosity_thold) {
                pcVar15 = common_log_main();
                common_log_add(pcVar15,GGML_LOG_LEVEL_ERROR,
                               "%s: chunk size (%lld) exceeds batch size (%lld), increase batch size and re-run\n"
                               ,"main",(long)batch.token - CONCAT44(batch._4_4_,batch.n_tokens) >> 2
                               ,uVar19);
                iVar12 = 1;
              }
            }
            else {
              iVar13 = llama_vocab_eos(uVar18);
              if ((-1 < iVar13) &&
                 (((llama_token *)CONCAT44(batch._4_4_,batch.n_tokens) == batch.token ||
                  (iVar13 = batch.token[-1], iVar14 = llama_vocab_eos(uVar18), iVar13 != iVar14))))
              {
                query_batch.n_tokens = llama_vocab_eos(uVar18);
                std::vector<int,_std::allocator<int>_>::emplace_back<int>
                          ((vector<int,_std::allocator<int>_> *)&batch,&query_batch.n_tokens);
              }
              std::vector<int,_std::allocator<int>_>::operator=
                        (&pcVar21->tokens,(vector<int,_std::allocator<int>_> *)&batch);
            }
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&batch);
            pcVar21 = pcVar21 + 1;
          } while (uVar22 <= uVar19);
        }
      }
      common_init_result::~common_init_result(&llama_init);
      std::vector<chunk,_std::allocator<chunk>_>::~vector(&chunks);
      goto LAB_00130243;
    }
    if (common_log_verbosity_thold < 0) goto LAB_00130243;
    pcVar15 = common_log_main();
    fmt = "context_files must be specified\n";
  }
  common_log_add(pcVar15,GGML_LOG_LEVEL_ERROR,fmt);
LAB_00130243:
  common_params::~common_params(&params);
  return iVar12;
}

Assistant:

int main(int argc, char ** argv) {
    common_params params;

    if (!common_params_parse(argc, argv, params, LLAMA_EXAMPLE_RETRIEVAL, print_usage)) {
        return 1;
    }

    common_init();

    // For BERT models, batch size must be equal to ubatch size
    params.n_ubatch = params.n_batch;
    params.embedding = true;

    if (params.chunk_size <= 0) {
        LOG_ERR("chunk_size must be positive\n");
        return 1;
    }
    if (params.context_files.empty()) {
        LOG_ERR("context_files must be specified\n");
        return 1;
    }

    LOG_INF("processing files:\n");
    for (auto & context_file : params.context_files) {
        LOG_INF("%s\n", context_file.c_str());
    }

    std::vector<chunk> chunks;
    for (auto & context_file : params.context_files) {
        std::vector<chunk> file_chunk = chunk_file(context_file, params.chunk_size, params.chunk_separator);
        chunks.insert(chunks.end(), file_chunk.begin(), file_chunk.end());
    }
    LOG_INF("Number of chunks: %zu\n", chunks.size());

    llama_backend_init();
    llama_numa_init(params.numa);

    // load the model
    common_init_result llama_init = common_init_from_params(params);

    llama_model * model = llama_init.model.get();
    llama_context * ctx = llama_init.context.get();

    if (model == NULL) {
        LOG_ERR("%s: unable to load model\n", __func__);
        return 1;
    }

    const llama_vocab * vocab = llama_model_get_vocab(model);

    const int n_ctx_train = llama_model_n_ctx_train(model);
    const int n_ctx = llama_n_ctx(ctx);

    const enum llama_pooling_type pooling_type = llama_pooling_type(ctx);
    if (pooling_type == LLAMA_POOLING_TYPE_NONE) {
        LOG_ERR("%s: pooling type NONE not supported\n", __func__);
        return 1;
    }

    if (n_ctx > n_ctx_train) {
        LOG_WRN("%s: warning: model was trained on only %d context tokens (%d specified)\n",
                __func__, n_ctx_train, n_ctx);
    }

    // print system information
    {
        LOG_INF("\n");
        LOG_INF("%s\n", common_params_get_system_info(params).c_str());
    }

    // max batch size
    const uint64_t n_batch = params.n_batch;
    GGML_ASSERT(params.n_batch >= params.n_ctx);

    // tokenize the prompts and trim
    for (auto & chunk : chunks) {
        auto inp = common_tokenize(ctx, chunk.textdata, true, false);
        if (inp.size() > n_batch) {
            LOG_ERR("%s: chunk size (%lld) exceeds batch size (%lld), increase batch size and re-run\n",
                    __func__, (long long int) inp.size(), (long long int) n_batch);
            return 1;
        }
        // add eos if not present
        if (llama_vocab_eos(vocab) >= 0 && (inp.empty() || inp.back() != llama_vocab_eos(vocab))) {
            inp.push_back(llama_vocab_eos(vocab));
        }
        chunk.tokens = inp;
    }

    // tokenization stats
    if (params.verbose_prompt) {
        for (int i = 0; i < (int) chunks.size(); i++) {
            LOG_INF("%s: prompt %d: '%s'\n", __func__, i, chunks[i].textdata.c_str());
            LOG_INF("%s: number of tokens in prompt = %zu\n", __func__, chunks[i].tokens.size());
            for (int j = 0; j < (int) chunks[i].tokens.size(); j++) {
                LOG_INF("%6d -> '%s'\n", chunks[i].tokens[j], common_token_to_piece(ctx, chunks[i].tokens[j]).c_str());
            }
            LOG_INF("\n\n");
        }
    }

    // initialize batch
    const int n_chunks = chunks.size();
    struct llama_batch batch = llama_batch_init(n_batch, 0, 1);

    // allocate output
    const int n_embd = llama_model_n_embd(model);
    std::vector<float> embeddings(n_chunks * n_embd, 0);
    float * emb = embeddings.data();

    // break into batches
    int p = 0; // number of prompts processed already
    int s = 0; // number of prompts in current batch
    for (int k = 0; k < n_chunks; k++) {
        // clamp to n_batch tokens
        auto & inp = chunks[k].tokens;

        const uint64_t n_toks = inp.size();

        // encode if at capacity
        if (batch.n_tokens + n_toks > n_batch) {
            float * out = emb + p * n_embd;
            batch_decode(ctx, batch, out, s, n_embd);
            common_batch_clear(batch);
            p += s;
            s = 0;
        }

        // add to batch
        batch_add_seq(batch, inp, s);
        s += 1;
    }

    // final batch
    float * out = emb + p * n_embd;
    batch_decode(ctx, batch, out, s, n_embd);

    // save embeddings to chunks
    for (int i = 0; i < n_chunks; i++) {
        chunks[i].embedding = std::vector<float>(emb + i * n_embd, emb + (i + 1) * n_embd);
        // clear tokens as they are no longer needed
        chunks[i].tokens.clear();
    }

    struct llama_batch query_batch = llama_batch_init(n_batch, 0, 1);

    // start loop, receive query and return top k similar chunks based on cosine similarity
    std::string query;
    while (true) {
        LOG("Enter query: ");
        std::getline(std::cin, query);
        std::vector<int32_t> query_tokens = common_tokenize(ctx, query, true);

        batch_add_seq(query_batch, query_tokens, 0);

        std::vector<float> query_emb(n_embd, 0);
        batch_decode(ctx, query_batch, query_emb.data(), 1, n_embd);

        common_batch_clear(query_batch);

        // compute cosine similarities
        {
            std::vector<std::pair<int, float>> similarities;
            for (int i = 0; i < n_chunks; i++) {
                float sim = common_embd_similarity_cos(chunks[i].embedding.data(), query_emb.data(), n_embd);
                similarities.push_back(std::make_pair(i, sim));
            }

            // sort similarities
            std::sort(similarities.begin(), similarities.end(), [](const std::pair<int, float> & a, const std::pair<int, float> & b) {
                return a.second > b.second;
            });

            LOG("Top %d similar chunks:\n", params.sampling.top_k);
            for (int i = 0; i < std::min(params.sampling.top_k, (int) chunks.size()); i++) {
                LOG("filename: %s\n", chunks[similarities[i].first].filename.c_str());
                LOG("filepos: %lld\n", (long long int) chunks[similarities[i].first].filepos);
                LOG("similarity: %f\n", similarities[i].second);
                LOG("textdata:\n%s\n", chunks[similarities[i].first].textdata.c_str());
                LOG("--------------------\n");
            }
        }
    }

    LOG("\n");
    llama_perf_context_print(ctx);

    // clean up
    llama_batch_free(query_batch);
    llama_backend_free();
}